

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall
cppcms::widgets::base_widget::generate(base_widget *this,int position,form_context *param_2)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  uVar1 = *(uint *)&this->field_0x1f0;
  if ((uVar1 & 0x10) == 0) {
    if ((this->name_)._M_string_length == 0) {
      impl::todec_string<int>(&local_38,position);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x23eac7);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_48 = *plVar3;
        lStack_40 = plVar2[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar3;
        local_58 = (long *)*plVar2;
      }
      local_50 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      uVar1 = *(uint *)&this->field_0x1f0;
    }
    *(uint *)&this->field_0x1f0 = uVar1 | 0x10;
  }
  return;
}

Assistant:

void base_widget::generate(int position,form_context * /*context*/)
{
	if(is_generation_done_)
		return;
	if(name_.empty()) {
		name_ = "_" + impl::todec_string(position);
	}
	is_generation_done_ = 1;
}